

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test.cpp
# Opt level: O2

bool __thiscall CppUnit::Test::findTestPath(Test *this,Test *test,TestPath *testPath)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  ulong uVar5;
  
  if (this == test) {
    (*testPath->_vptr_TestPath[3])(testPath,this);
  }
  else {
    uVar2 = (*this->_vptr_Test[4])(this);
    uVar5 = 0;
    uVar4 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar4 = uVar5;
    }
    do {
      if ((int)uVar4 == (int)uVar5) {
        return false;
      }
      iVar3 = (*this->_vptr_Test[5])(this,uVar5);
      cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x40))
                        ((long *)CONCAT44(extraout_var,iVar3),test,testPath);
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (cVar1 == '\0');
    (*testPath->_vptr_TestPath[5])(testPath,this,0);
  }
  return true;
}

Assistant:

bool 
Test::findTestPath( const Test *test,
                    TestPath &testPath ) const
{
  Test *mutableThis = CPPUNIT_CONST_CAST( Test *, this );
  if ( this == test )
  {
    testPath.add( mutableThis );
    return true;
  }

  int childCount = getChildTestCount();
  for ( int childIndex =0; childIndex < childCount; ++childIndex )
  {
    if ( getChildTestAt( childIndex )->findTestPath( test, testPath ) )
    {
      testPath.insert( mutableThis, 0 );
      return true;
    }
  }

  return false;
}